

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>
               (SnapObject *snpObject,FileWriter *writer)

{
  SnapHeapArgumentsInfo *pSVar1;
  uint32 i;
  ulong uVar2;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)14>
                     (snpObject);
  FileWriter::WriteUInt32(writer,numberOfArgs,pSVar1->NumOfArguments,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)pSVar1->IsFrameNullPtr,1);
  FileWriter::WriteAddr(writer,objectId,pSVar1->FrameObject,CommaSeparator);
  FileWriter::WriteLengthValue(writer,pSVar1->FormalCount,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x48,1);
  (*writer->_vptr_FileWriter[4])(writer,0);
  for (uVar2 = 0; uVar2 < pSVar1->FormalCount; uVar2 = uVar2 + 1) {
    (*writer->_vptr_FileWriter[0xb])
              (writer,(ulong)pSVar1->DeletedArgFlags[uVar2],(ulong)(uVar2 != 0));
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void EmitAddtlInfo_SnapHeapArgumentsInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapHeapArgumentsInfo* argsInfo = SnapObjectGetAddtlInfoAs<SnapHeapArgumentsInfo*, argsKind>(snpObject);

            writer->WriteUInt32(NSTokens::Key::numberOfArgs, argsInfo->NumOfArguments, NSTokens::Separator::CommaAndBigSpaceSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, argsInfo->IsFrameNullPtr, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::objectId, argsInfo->FrameObject, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(argsInfo->FormalCount, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::deletedArgs, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < argsInfo->FormalCount; ++i)
            {
                writer->WriteNakedByte(argsInfo->DeletedArgFlags[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }